

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall
CEditor::RenderBackground
          (CEditor *this,CUIRect View,CTextureHandle Texture,float Size,float Brightness)

{
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (this->m_pGraphics,CONCAT44(in_register_00000034,Texture.m_Id));
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (Brightness,Brightness,Brightness,0x3f800000);
  local_48 = View.w;
  fStack_44 = View.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1a])
            (0,0,local_48 / Size,fStack_44 / Size,this->m_pGraphics,0xffffffff);
  local_38 = View.x;
  fStack_34 = View.y;
  local_28 = local_38;
  fStack_24 = fStack_34;
  fStack_20 = local_48;
  fStack_1c = fStack_44;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_28,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderBackground(CUIRect View, IGraphics::CTextureHandle Texture, float Size, float Brightness)
{
	Graphics()->TextureSet(Texture);
	Graphics()->BlendNormal();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(Brightness, Brightness, Brightness, 1.0f);
	Graphics()->QuadsSetSubset(0,0, View.w/Size, View.h/Size);
	IGraphics::CQuadItem QuadItem(View.x, View.y, View.w, View.h);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
}